

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O2

bool sf::priv::JoystickImpl::isConnected(uint index)

{
  undefined1 uVar1;
  int iVar2;
  udev_device *udevDevice;
  pollfd local_18;
  
  if ((anonymous_namespace)::udevMonitor == 0) {
    anon_unknown.dwarf_1e6d9c::updatePluggedList((udev_device *)0x0);
  }
  else {
    local_18.fd = udev_monitor_get_fd();
    local_18.events = 1;
    local_18.revents = 0;
    iVar2 = poll(&local_18,1,0);
    if ((0 < iVar2) && (((ulong)local_18 & 0x1000000000000) != 0)) {
      udevDevice = (udev_device *)udev_monitor_receive_device((anonymous_namespace)::udevMonitor);
      anon_unknown.dwarf_1e6d9c::updatePluggedList(udevDevice);
      if (udevDevice != (udev_device *)0x0) {
        udev_device_unref(udevDevice);
      }
    }
  }
  if ((ulong)index < (ulong)((DAT_001ccdd8 - (anonymous_namespace)::joystickList) / 0x48)) {
    uVar1 = *(undefined1 *)((anonymous_namespace)::joystickList + 0x40 + (ulong)index * 0x48);
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool JoystickImpl::isConnected(unsigned int index)
{
    // See if we can skip scanning if udev monitor is available
    if (!udevMonitor)
    {
        // udev monitor is not available, perform a scan every query
        updatePluggedList();
    }
    else if (hasMonitorEvent())
    {
        // Check if new joysticks were added/removed since last update
        udev_device* udevDevice = udev_monitor_receive_device(udevMonitor);

        // If we can get the specific device, we check that,
        // otherwise just do a full scan if udevDevice == NULL
        updatePluggedList(udevDevice);

        if (udevDevice)
            udev_device_unref(udevDevice);
    }

    if (index >= joystickList.size())
        return false;

    // Then check if the joystick is connected
    return joystickList[index].plugged;
}